

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O2

double normal_truncated_a_sample(double mu,double s,double a,int *seed)

{
  double dVar1;
  double dVar2;
  
  dVar1 = normal_01_cdf((a - mu) / s);
  dVar2 = r8_uniform_01(seed);
  dVar1 = normal_01_cdf_inv(dVar2 * (1.0 - dVar1) + dVar1);
  return dVar1 * s + mu;
}

Assistant:

double normal_truncated_a_sample ( double mu, double s, double a, int &seed )

//****************************************************************************80
//
//  Purpose:
//
//    NORMAL_TRUNCATED_A_SAMPLE samples the lower truncated Normal PDF.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    21 August 2013
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, double MU, S, the mean and standard deviation of the
//    parent Normal distribution.
//
//    Input, double A, the lower truncation limit.
//
//    Input/output, int &SEED, a seed for the random number
//    generator.
//
//    Output, double NORMAL_TRUNCATED_A_SAMPLE, a sample of the PDF.
//
{
  double alpha;
  double alpha_cdf;
  double u;
  double x;
  double xi;
  double xi_cdf;

  alpha = ( a - mu ) / s;

  alpha_cdf = normal_01_cdf ( alpha );

  u = r8_uniform_01 ( seed );
  xi_cdf = alpha_cdf + u * ( 1.0 - alpha_cdf );
  xi = normal_01_cdf_inv ( xi_cdf );

  x = mu + s * xi;

  return x;
}